

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynContinue * ParseContinue(ParseContext *ctx)

{
  Lexeme *begin;
  bool bVar1;
  SynNumber *number;
  Lexeme *end;
  SynNumber *node;
  Lexeme *start;
  ParseContext *ctx_local;
  
  begin = ctx->currentLexeme;
  bVar1 = ParseContext::Consume(ctx,lex_continue);
  if (bVar1) {
    number = ParseNumber(ctx);
    anon_unknown.dwarf_fc7e::CheckConsume
              (ctx,lex_semicolon,"ERROR: continue statement must be followed by \';\' or a constant"
              );
    ctx_local = (ParseContext *)ParseContext::get<SynContinue>(ctx);
    end = ParseContext::Previous(ctx);
    SynContinue::SynContinue((SynContinue *)ctx_local,begin,end,number);
  }
  else {
    ctx_local = (ParseContext *)0x0;
  }
  return (SynContinue *)ctx_local;
}

Assistant:

SynContinue* ParseContinue(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_continue))
	{
		// Optional
		SynNumber *node = ParseNumber(ctx);

		CheckConsume(ctx, lex_semicolon, "ERROR: continue statement must be followed by ';' or a constant");

		return new (ctx.get<SynContinue>()) SynContinue(start, ctx.Previous(), node);
	}

	return NULL;
}